

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_start_seq(Parser *this,bool as_child)

{
  pfn_error p_Var1;
  size_t sVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  csubstr tag;
  csubstr tag_00;
  csubstr tag_01;
  csubstr tag_02;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  csubstr key_00;
  bool bVar8;
  error_flags eVar9;
  NodeData *pNVar10;
  NodeData *pNVar11;
  size_t sVar12;
  Parser *pPVar13;
  byte in_SIL;
  Parser *in_RDI;
  type_bits as_doc_1;
  char msg_4 [50];
  type_bits as_doc;
  csubstr key;
  type_bits key_quoted;
  char msg_3 [42];
  char msg_2 [77];
  char msg_1 [34];
  size_t parent_id;
  char msg [58];
  size_t child;
  flag_t in_stack_fffffffffffffa98;
  flag_t in_stack_fffffffffffffa9c;
  Parser *in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  Location *in_stack_fffffffffffffab0;
  Tree *in_stack_fffffffffffffab8;
  Location *in_stack_fffffffffffffac0;
  Parser *in_stack_fffffffffffffae8;
  Tree *in_stack_fffffffffffffaf0;
  Tree *in_stack_fffffffffffffaf8;
  pfn_error in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  Tree *pTVar14;
  undefined8 in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  pfn_error in_stack_fffffffffffffb58;
  Parser *in_stack_fffffffffffffb60;
  size_t local_480;
  Parser *pPVar15;
  type_bits in_stack_fffffffffffffbb0;
  size_t in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbc0 [16];
  Parser *in_stack_fffffffffffffbd0;
  type_bits in_stack_fffffffffffffbf0;
  size_t in_stack_fffffffffffffbf8;
  Tree *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  size_t in_stack_fffffffffffffc10;
  undefined8 uStack_3e8;
  size_t local_3e0;
  undefined1 local_3d8 [56];
  size_t local_3a0;
  char *local_398;
  Tree *in_stack_fffffffffffffc70;
  char *local_350;
  size_t sStack_348;
  char *local_340;
  size_t sStack_338;
  size_t local_330;
  char local_328 [56];
  char *local_2f0;
  Parser *pPStack_2e8;
  char *local_2e0;
  Location *pLStack_2d8;
  Tree *local_2d0;
  char local_2c8 [88];
  undefined8 local_270;
  Parser *pPStack_268;
  char *local_260;
  Location *pLStack_258;
  Tree *local_250;
  char local_248 [48];
  size_t local_218;
  undefined8 local_210;
  Parser *pPStack_208;
  char *local_200;
  Location *pLStack_1f8;
  Tree *local_1f0;
  char local_1e8 [71];
  byte local_1a1;
  csubstr *local_198;
  csubstr *local_190;
  size_t local_188;
  Tree *local_180;
  size_t local_178;
  Tree *local_170;
  NodeData *local_168;
  size_t local_160;
  Tree *local_158;
  NodeData *local_150;
  size_t local_148;
  Tree *local_140;
  size_t local_138;
  Tree *local_130;
  undefined8 local_128;
  Parser *pPStack_120;
  char *local_118;
  Location *pLStack_110;
  Tree *local_108;
  stack<c4::yml::Parser::State,_16UL> *local_100;
  undefined8 local_f8;
  Parser *pPStack_f0;
  char *local_e8;
  Location *pLStack_e0;
  Tree *local_d8;
  long local_d0;
  stack<c4::yml::Parser::State,_16UL> *local_c8;
  size_t local_c0;
  Parser *pPStack_b0;
  char *in_stack_ffffffffffffff58;
  Location *in_stack_ffffffffffffff60;
  Tree *in_stack_ffffffffffffff68;
  Tree *in_stack_ffffffffffffff70;
  Parser *pPStack_88;
  char *local_80;
  Location *pLStack_78;
  Tree *local_70;
  undefined8 local_68;
  Parser *pPStack_60;
  char *local_58;
  Location *pLStack_50;
  Tree *local_48;
  
  local_1a1 = in_SIL & 1;
  bVar8 = has_all(in_RDI,3);
  if (bVar8) {
    (in_RDI->m_val_tag).str = (in_RDI->m_key_tag).str;
    (in_RDI->m_val_tag).len = (in_RDI->m_key_tag).len;
    basic_substring<const_char>::clear(&in_RDI->m_key_tag);
  }
  addrem_flags(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98);
  local_100 = &in_RDI->m_stack;
  if ((in_RDI->m_stack).m_size == 0) {
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                       (size_t)in_stack_fffffffffffffaa0,
                       CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    in_stack_fffffffffffffa98 = (flag_t)local_128;
    in_stack_fffffffffffffa9c = (flag_t)((ulong)local_128 >> 0x20);
    loc.super_LineCol.line = in_stack_fffffffffffffb08;
    loc.super_LineCol.offset = (size_t)in_stack_fffffffffffffb00;
    loc.super_LineCol.col = in_stack_fffffffffffffb10;
    loc.name.str = (char *)in_stack_fffffffffffffb18;
    loc.name.len._0_7_ = in_stack_fffffffffffffb20;
    loc.name.len._7_1_ = in_stack_fffffffffffffb27;
    error<25ul>((char (*) [25])in_stack_fffffffffffffaf0,loc);
    in_stack_fffffffffffffaa0 = pPStack_120;
    in_stack_fffffffffffffaa8 = local_118;
    in_stack_fffffffffffffab0 = pLStack_110;
    in_stack_fffffffffffffab8 = local_108;
  }
  pNVar10 = node(in_stack_fffffffffffffaa0,
                 (State *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  pNVar11 = node(in_stack_fffffffffffffaa0,
                 CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  if (pNVar10 != pNVar11) {
    memcpy(local_1e8,"check failed: (node(m_stack.bottom()) == node(m_root_id))",0x3a);
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                       (size_t)in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8,
                       (size_t)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffa98 = (flag_t)local_210;
    in_stack_fffffffffffffa9c = (flag_t)((ulong)local_210 >> 0x20);
    LVar3.super_LineCol.line = (size_t)pPStack_208;
    LVar3.super_LineCol.offset = local_210;
    LVar3.super_LineCol.col = (size_t)local_200;
    LVar3.name.str = (char *)pLStack_1f8;
    LVar3.name.len = (size_t)local_1f0;
    (*p_Var1)(local_1e8,0x3a,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffaa0 = pPStack_208;
    in_stack_fffffffffffffaa8 = local_200;
    in_stack_fffffffffffffab0 = pLStack_1f8;
    in_stack_fffffffffffffab8 = local_1f0;
  }
  sVar12 = detail::stack<c4::yml::Parser::State,_16UL>::size(&in_RDI->m_stack);
  pPVar15 = in_RDI;
  if (sVar12 < 2) {
    local_480 = in_RDI->m_root_id;
  }
  else {
    local_c8 = &in_RDI->m_stack;
    local_d0 = 1;
    if ((in_RDI->m_stack).m_size < 2) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                         (size_t)in_stack_fffffffffffffaa0,
                         CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      in_stack_fffffffffffffa98 = (flag_t)local_f8;
      in_stack_fffffffffffffa9c = (flag_t)((ulong)local_f8 >> 0x20);
      loc_00.super_LineCol.line = in_stack_fffffffffffffb08;
      loc_00.super_LineCol.offset = (size_t)in_stack_fffffffffffffb00;
      loc_00.super_LineCol.col = in_stack_fffffffffffffb10;
      loc_00.name.str = (char *)in_stack_fffffffffffffb18;
      loc_00.name.len._0_7_ = in_stack_fffffffffffffb20;
      loc_00.name.len._7_1_ = in_stack_fffffffffffffb27;
      error<25ul>((char (*) [25])in_stack_fffffffffffffaf0,loc_00);
      in_stack_fffffffffffffaa0 = pPStack_f0;
      in_stack_fffffffffffffaa8 = local_e8;
      in_stack_fffffffffffffab0 = pLStack_e0;
      in_stack_fffffffffffffab8 = local_d8;
    }
    local_480 = (in_RDI->m_stack).m_stack[((in_RDI->m_stack).m_size - 1) - local_d0].node_id;
  }
  local_218 = local_480;
  if (local_480 == 0xffffffffffffffff) {
    memcpy(local_248,"check failed: (parent_id != NONE)",0x22);
    eVar9 = get_error_flags();
    if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      trap_instruction();
    }
    p_Var1 = (pPVar15->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                       (size_t)in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8,
                       (size_t)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffa98 = (flag_t)local_270;
    in_stack_fffffffffffffa9c = (flag_t)((ulong)local_270 >> 0x20);
    LVar4.super_LineCol.line = (size_t)pPStack_268;
    LVar4.super_LineCol.offset = local_270;
    LVar4.super_LineCol.col = (size_t)local_260;
    LVar4.name.str = (char *)pLStack_258;
    LVar4.name.len = (size_t)local_250;
    (*p_Var1)(local_248,0x22,LVar4,(pPVar15->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffaa0 = pPStack_268;
    in_stack_fffffffffffffaa8 = local_260;
    in_stack_fffffffffffffab0 = pLStack_258;
    in_stack_fffffffffffffab8 = local_250;
  }
  pNVar10 = node(in_stack_fffffffffffffaa0,
                 (State *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  if (pNVar10 != (NodeData *)0x0) {
    in_stack_fffffffffffffb60 =
         (Parser *)
         node(in_stack_fffffffffffffaa0,
              (State *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    pPVar13 = (Parser *)
              node(in_stack_fffffffffffffaa0,
                   CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    if (in_stack_fffffffffffffb60 != pPVar13) {
      memcpy(local_2c8,
             "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))",0x4d);
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        trap_instruction();
      }
      in_stack_fffffffffffffb58 = (pPVar15->m_stack).m_callbacks.m_error;
      Location::Location(in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                         (size_t)in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8,
                         (size_t)in_stack_fffffffffffffaa0);
      in_stack_fffffffffffffa98 = (flag_t)local_2f0;
      in_stack_fffffffffffffa9c = (flag_t)((ulong)local_2f0 >> 0x20);
      LVar5.super_LineCol.line = (size_t)pPStack_2e8;
      LVar5.super_LineCol.offset = (size_t)local_2f0;
      LVar5.super_LineCol.col = (size_t)local_2e0;
      LVar5.name.str = (char *)pLStack_2d8;
      LVar5.name.len = (size_t)local_2d0;
      (*in_stack_fffffffffffffb58)(local_2c8,0x4d,LVar5,(pPVar15->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffffaa0 = pPStack_2e8;
      in_stack_fffffffffffffaa8 = local_2e0;
      in_stack_fffffffffffffab0 = pLStack_2d8;
      in_stack_fffffffffffffab8 = local_2d0;
    }
  }
  sVar12 = local_218;
  pTVar14 = in_stack_fffffffffffffbc0._0_8_;
  if ((local_1a1 & 1) == 0) {
    pPVar15->m_state->node_id = local_218;
    local_140 = pPVar15->m_tree;
    local_148 = pPVar15->m_state->node_id;
    Tree::_p(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8);
    local_158 = pPVar15->m_tree;
    local_160 = local_218;
    local_150 = Tree::_p(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8);
    if (((local_150->m_type).type & SEQ) == NOTYPE) {
      bVar8 = Tree::has_children((Tree *)in_stack_fffffffffffffaa0,
                                 CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      if (bVar8) {
        eVar9 = get_error_flags();
        if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          trap_instruction();
        }
        Location::Location(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                           (size_t)in_stack_fffffffffffffaa0,
                           CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        loc_04.super_LineCol.line = in_stack_fffffffffffffb08;
        loc_04.super_LineCol.offset = (size_t)in_stack_fffffffffffffb00;
        loc_04.super_LineCol.col = in_stack_fffffffffffffb10;
        loc_04.name.str = (char *)in_stack_fffffffffffffb18;
        loc_04.name.len._0_7_ = in_stack_fffffffffffffb20;
        loc_04.name.len._7_1_ = in_stack_fffffffffffffb27;
        error<47ul>((char (*) [47])in_stack_fffffffffffffaf0,loc_04);
      }
      Tree::to_seq(pTVar14,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    }
    else {
      Tree::_add_flags(in_stack_fffffffffffffab8,(size_t)in_stack_fffffffffffffab0,
                       (type_bits)in_stack_fffffffffffffaa8);
    }
    _move_scalar_from_top(pPVar15);
    _write_val_anchor(in_stack_fffffffffffffb60,(size_t)in_stack_fffffffffffffb58);
    in_stack_fffffffffffffae8 = (Parser *)(pPVar15->m_state->line_contents).rem.str;
    pNVar10 = Tree::_p(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8);
    (pNVar10->m_val).scalar.str = (char *)in_stack_fffffffffffffae8;
  }
  else {
    local_180 = pPVar15->m_tree;
    local_188 = local_218;
    pNVar10 = Tree::_p(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8);
    sVar2 = pNVar10->m_last_child;
    if (sVar12 == 0xffffffffffffffff) {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                         (size_t)in_stack_fffffffffffffaa0,
                         CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      in_stack_fffffffffffffa98 = (flag_t)local_68;
      in_stack_fffffffffffffa9c = (flag_t)((ulong)local_68 >> 0x20);
      loc_01.super_LineCol.line = in_stack_fffffffffffffb08;
      loc_01.super_LineCol.offset = (size_t)in_stack_fffffffffffffb00;
      loc_01.super_LineCol.col = in_stack_fffffffffffffb10;
      loc_01.name.str = (char *)in_stack_fffffffffffffb18;
      loc_01.name.len._0_7_ = in_stack_fffffffffffffb20;
      loc_01.name.len._7_1_ = in_stack_fffffffffffffb27;
      error<29ul>((char (*) [29])in_stack_fffffffffffffaf0,loc_01);
      in_stack_fffffffffffffaa0 = pPStack_60;
      in_stack_fffffffffffffaa8 = local_58;
      in_stack_fffffffffffffab0 = pLStack_50;
      in_stack_fffffffffffffab8 = local_48;
    }
    pNVar10 = Tree::_p(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8);
    if ((((pNVar10->m_type).type & (STREAM|MAP)) == NOTYPE) &&
       (bVar8 = Tree::is_root(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8), !bVar8))
    {
      eVar9 = get_error_flags();
      if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                         (size_t)in_stack_fffffffffffffaa0,
                         CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      in_stack_fffffffffffffa98 = (flag_t)in_stack_ffffffffffffff70;
      in_stack_fffffffffffffa9c = (flag_t)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      loc_02.super_LineCol.line = in_stack_fffffffffffffb08;
      loc_02.super_LineCol.offset = (size_t)in_stack_fffffffffffffb00;
      loc_02.super_LineCol.col = in_stack_fffffffffffffb10;
      loc_02.name.str = (char *)in_stack_fffffffffffffb18;
      loc_02.name.len._0_7_ = in_stack_fffffffffffffb20;
      loc_02.name.len._7_1_ = in_stack_fffffffffffffb27;
      error<54ul>((char (*) [54])in_stack_fffffffffffffaf0,loc_02);
      in_stack_fffffffffffffaa0 = pPStack_88;
      in_stack_fffffffffffffaa8 = local_80;
      in_stack_fffffffffffffab0 = pLStack_78;
      in_stack_fffffffffffffab8 = local_70;
    }
    if ((sVar2 != 0xffffffffffffffff) &&
       (pNVar10 = Tree::_p(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8),
       pNVar10->m_parent != sVar12)) {
      eVar9 = get_error_flags();
      in_stack_fffffffffffffab8 = in_stack_ffffffffffffff68;
      if (((eVar9 & 1) != 0) &&
         (bVar8 = is_debugger_attached(), in_stack_fffffffffffffab8 = in_stack_ffffffffffffff68,
         bVar8)) {
        trap_instruction();
        in_stack_fffffffffffffab8 = in_stack_ffffffffffffff68;
      }
      Location::Location(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,
                         (size_t)in_stack_fffffffffffffaa0,
                         CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      in_stack_fffffffffffffab0 = in_stack_ffffffffffffff60;
      in_stack_fffffffffffffaa8 = in_stack_ffffffffffffff58;
      loc_03.super_LineCol.line = in_stack_fffffffffffffb08;
      loc_03.super_LineCol.offset = (size_t)in_stack_fffffffffffffb00;
      loc_03.super_LineCol.col = in_stack_fffffffffffffb10;
      loc_03.name.str = (char *)in_stack_fffffffffffffb18;
      loc_03.name.len._0_7_ = in_stack_fffffffffffffb20;
      loc_03.name.len._7_1_ = in_stack_fffffffffffffb27;
      in_stack_ffffffffffffff58 = in_stack_fffffffffffffaa8;
      in_stack_ffffffffffffff60 = in_stack_fffffffffffffab0;
      in_stack_ffffffffffffff68 = in_stack_fffffffffffffab8;
      error<63ul>((char (*) [63])in_stack_fffffffffffffaf0,loc_03);
      in_stack_fffffffffffffaa0 = pPStack_b0;
    }
    local_c0 = Tree::_claim(in_stack_fffffffffffffc70);
    Tree::_set_hierarchy
              (in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
               (size_t)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
    pPVar15->m_state->node_id = local_c0;
    bVar8 = has_all(pPVar15,0x200);
    sVar12 = in_stack_fffffffffffffbc0._8_8_;
    pTVar14 = in_stack_fffffffffffffbc0._0_8_;
    if (bVar8) {
      local_170 = pPVar15->m_tree;
      local_178 = local_218;
      local_168 = Tree::_p(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8);
      if (((local_168->m_type).type & MAP) == NOTYPE) {
        memcpy(local_328,"check failed: (m_tree->is_map(parent_id))",0x2a);
        eVar9 = get_error_flags();
        if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          trap_instruction();
        }
        p_Var1 = (pPVar15->m_stack).m_callbacks.m_error;
        Location::Location(in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                           (size_t)in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8,
                           (size_t)in_stack_fffffffffffffaa0);
        LVar6.super_LineCol.line = sStack_348;
        LVar6.super_LineCol.offset = (size_t)local_350;
        LVar6.super_LineCol.col = (size_t)local_340;
        LVar6.name.str = (char *)sStack_338;
        LVar6.name.len = local_330;
        (*p_Var1)(local_328,0x2a,LVar6,(pPVar15->m_stack).m_callbacks.m_user_data);
      }
      _consume_scalar(in_stack_fffffffffffffae8);
      key_00.len = in_stack_fffffffffffffc10;
      key_00.str = in_stack_fffffffffffffc08;
      Tree::to_seq(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,key_00,
                   in_stack_fffffffffffffbf0);
      _write_key_anchor(in_stack_fffffffffffffbd0,sVar12);
      local_190 = &pPVar15->m_key_tag;
      bVar8 = true;
      if ((pPVar15->m_key_tag).len != 0) {
        bVar8 = local_190->str == (char *)0x0;
      }
      if (!bVar8) {
        pTVar14 = pPVar15->m_tree;
        local_398 = (pPVar15->m_key_tag).str;
        tag.len = (size_t)in_stack_fffffffffffffaf0;
        tag.str = (char *)in_stack_fffffffffffffae8;
        normalize_tag(tag);
        tag_02.len = (size_t)pTVar14;
        tag_02.str = (char *)in_stack_fffffffffffffb00;
        Tree::set_key_tag(in_stack_fffffffffffffaf8,(size_t)in_stack_fffffffffffffaf0,tag_02);
        basic_substring<const_char>::clear(&pPVar15->m_key_tag);
      }
    }
    else {
      local_3a0 = 0;
      local_130 = pPVar15->m_tree;
      local_138 = pPVar15->m_state->node_id;
      pNVar10 = Tree::_p(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8);
      if (((pNVar10->m_type).type & DOC) != NOTYPE) {
        memcpy(local_3d8,"check failed: (!m_tree->is_doc(m_state->node_id))",0x32);
        eVar9 = get_error_flags();
        if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          trap_instruction();
        }
        in_stack_fffffffffffffb00 = (pPVar15->m_stack).m_callbacks.m_error;
        in_stack_fffffffffffffaf8 = (Tree *)local_3d8;
        Location::Location(in_stack_fffffffffffffac0,(char *)in_stack_fffffffffffffab8,
                           (size_t)in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8,
                           (size_t)in_stack_fffffffffffffaa0);
        LVar7.super_LineCol.line = (size_t)in_stack_fffffffffffffc08;
        LVar7.super_LineCol.offset = (size_t)in_stack_fffffffffffffc00;
        LVar7.super_LineCol.col = in_stack_fffffffffffffc10;
        LVar7.name.str = (char *)uStack_3e8;
        LVar7.name.len = local_3e0;
        (*in_stack_fffffffffffffb00)
                  ((char *)in_stack_fffffffffffffaf8,0x32,LVar7,
                   (pPVar15->m_stack).m_callbacks.m_user_data);
      }
      Tree::to_seq(pTVar14,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
    }
    _write_val_anchor(in_stack_fffffffffffffb60,(size_t)in_stack_fffffffffffffb58);
    in_stack_fffffffffffffaf0 = (Tree *)(pPVar15->m_state->line_contents).rem.str;
    pNVar10 = Tree::_p(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8);
    (pNVar10->m_val).scalar.str = (char *)in_stack_fffffffffffffaf0;
  }
  local_198 = &pPVar15->m_val_tag;
  bVar8 = true;
  if ((pPVar15->m_val_tag).len != 0) {
    bVar8 = local_198->str == (char *)0x0;
  }
  if (!bVar8) {
    tag_00.len = (size_t)in_stack_fffffffffffffaf0;
    tag_00.str = (char *)in_stack_fffffffffffffae8;
    normalize_tag(tag_00);
    tag_01.len = (size_t)in_stack_fffffffffffffb00;
    tag_01.str = (char *)in_stack_fffffffffffffaf8;
    Tree::set_val_tag(in_stack_fffffffffffffaf0,(size_t)in_stack_fffffffffffffae8,tag_01);
    basic_substring<const_char>::clear(&pPVar15->m_val_tag);
  }
  return;
}

Assistant:

void Parser::_start_seq(bool as_child)
{
    _c4dbgpf("start_seq (as child={})", as_child);
    if(has_all(RTOP|RUNK))
    {
        _c4dbgpf("start_seq: moving key tag to val tag: '{}'", m_key_tag);
        m_val_tag = m_key_tag;
        m_key_tag.clear();
    }
    addrem_flags(RSEQ|RVAL, RUNK);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        m_state->node_id = m_tree->append_child(parent_id);
        if(has_all(SSCL))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_map(parent_id));
            type_bits key_quoted = 0;
            if(m_state->flags & QSCL) // before consuming the scalar
                key_quoted |= KEYQUO;
            csubstr key = _consume_scalar();
            m_tree->to_seq(m_state->node_id, key, key_quoted);
            _c4dbgpf("start_seq: id={} name='{}'", m_state->node_id, m_tree->key(m_state->node_id));
            _write_key_anchor(m_state->node_id);
            if( ! m_key_tag.empty())
            {
                _c4dbgpf("start_seq[{}]: set key tag='{}' -> '{}'", m_state->node_id, m_key_tag, normalize_tag(m_key_tag));
                m_tree->set_key_tag(m_state->node_id, normalize_tag(m_key_tag));
                m_key_tag.clear();
            }
        }
        else
        {
            type_bits as_doc = 0;
            _RYML_CB_ASSERT(m_stack.m_callbacks, !m_tree->is_doc(m_state->node_id));
            m_tree->to_seq(m_state->node_id, as_doc);
            _c4dbgpf("start_seq: id={}{}", m_state->node_id, as_doc ? " as doc" : "");
        }
        _write_val_anchor(m_state->node_id);
        m_tree->_p(m_state->node_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    else
    {
        m_state->node_id = parent_id;
        type_bits as_doc = 0;
        if(m_tree->is_doc(m_state->node_id))
            as_doc |= DOC;
        if(!m_tree->is_seq(parent_id))
        {
            RYML_CHECK(!m_tree->has_children(parent_id));
            m_tree->to_seq(parent_id, as_doc);
        }
        else
        {
            m_tree->_add_flags(parent_id, as_doc);
        }
        _move_scalar_from_top();
        _c4dbgpf("start_seq: id={}{}", m_state->node_id, as_doc ? " as_doc" : "");
        _write_val_anchor(parent_id);
        m_tree->_p(parent_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("start_seq[{}]: set val tag='{}' -> '{}'", m_state->node_id, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
}